

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O0

string * __thiscall OpenMD::SectionParser::stripComments(SectionParser *this,string *line)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong in_RDX;
  string *in_RDI;
  uint i;
  bool m_cmt;
  bool s_cmt;
  uint n;
  string *res;
  uint local_24;
  
  uVar3 = std::__cxx11::string::length();
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = false;
  bVar2 = false;
  for (local_24 = 0; local_24 < uVar3; local_24 = local_24 + 1) {
    if ((bVar1) && (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar4 == '\n')) {
      bVar1 = false;
    }
    else if ((bVar2) &&
            ((pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar4 == '*' &&
             (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar4 == '/')))) {
      bVar2 = false;
      local_24 = local_24 + 1;
    }
    else if ((!bVar1) && (!bVar2)) {
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX);
      if (((*pcVar4 == '/') &&
          (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar4 == '/')) ||
         (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar4 == '#')) {
        bVar1 = true;
        local_24 = local_24 + 1;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX);
        if ((*pcVar4 == '/') &&
           (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar4 == '*')) {
          bVar2 = true;
          local_24 = local_24 + 1;
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[](in_RDX);
          std::__cxx11::string::operator+=((string *)in_RDI,*pcVar4);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string SectionParser::stripComments(const std::string& line) {
    unsigned int n = line.length();
    std::string res;

    // Flags to indicate that single line and multpile line comments
    // have started or not.
    bool s_cmt = false;
    bool m_cmt = false;

    // Traverse the line
    for (unsigned int i = 0; i < n; i++) {
      // If single line comment flag is on, then check for end of it
      if (s_cmt == true && line[i] == '\n') s_cmt = false;

      // If multiple line comment is on, then check for end of it
      else if (m_cmt == true && line[i] == '*' && line[i + 1] == '/')
        m_cmt = false, i++;

      // If this character is in a comment, ignore it
      else if (s_cmt || m_cmt)
        continue;

      // Check for beginning of comments and set the approproate flags
      else if ((line[i] == '/' && line[i + 1] == '/') || (line[i] == '#'))
        s_cmt = true, i++;
      else if (line[i] == '/' && line[i + 1] == '*')
        m_cmt = true, i++;

      // If current character is a non-comment character, append it to res
      else
        res += line[i];
    }
    return res;
  }